

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O3

void __thiscall SymbolData::startModule(SymbolData *this,AssemblerFile *file)

{
  pointer pSVar1;
  long lVar2;
  long lVar3;
  SymDataModule module;
  value_type local_78;
  
  pSVar1 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar2 = (long)(this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 3) * 0x4ec4ec4ec4ec4ec5;
    lVar3 = 0;
    do {
      if (pSVar1->file == file) {
        this->currentModule = (int)lVar3;
        return;
      }
      lVar3 = lVar3 + 1;
      pSVar1 = pSVar1 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78.data._M_t._M_impl.super__Rb_tree_header._M_header;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.file = file;
  local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<SymDataModule,_std::allocator<SymDataModule>_>::push_back(&this->modules,&local_78);
  this->currentModule =
       (int)((ulong)((long)(this->modules).
                           super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->modules).
                          super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) * -0x3b13b13b + -1;
  std::
  _Rb_tree<SymDataData,_SymDataData,_std::_Identity<SymDataData>,_std::less<SymDataData>,_std::allocator<SymDataData>_>
  ::~_Rb_tree(&local_78.data._M_t);
  if (local_78.functions.super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.functions.
                    super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.functions.
                          super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.functions.
                          super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::~vector(&local_78.symbols);
  return;
}

Assistant:

void SymbolData::startModule(AssemblerFile* file)
{
	for (size_t i = 0; i < modules.size(); i++)
	{
		if (modules[i].file == file)
		{
			currentModule = (int)i;
			return;
		}
	}

	SymDataModule module;
	module.file = file;
	modules.push_back(module);
	currentModule = (int)modules.size()-1;
}